

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *file_00;
  Printer *printer_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  string *psVar6;
  undefined4 extraout_var;
  pointer pZVar7;
  LogMessage *other;
  undefined1 local_2b8 [8];
  Printer printer;
  LogMessage local_210;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_1d8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  FileDescriptorProto fdp;
  StringPiece local_e8;
  undefined1 local_d8 [8];
  string filename;
  string module_name;
  MutexLock lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_68;
  int i;
  undefined1 local_58 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  bool cpp_generated_lib_linked;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_58);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_58);
  local_68 = 0;
  do {
    uVar3 = (ulong)local_68;
    sVar4 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_58);
    if (sVar4 <= uVar3) {
      internal::MutexLock::MutexLock((MutexLock *)((long)&module_name.field_2 + 8),&this->mutex_);
      this->file_ = file;
      psVar6 = FileDescriptor::name_abi_cxx11_(file);
      anon_unknown_0::ModuleName((string *)((long)&filename.field_2 + 8),psVar6);
      std::__cxx11::string::string((string *)local_d8,(string *)(filename.field_2._M_local_buf + 8))
      ;
      ReplaceCharacters((string *)local_d8,".",'/');
      std::__cxx11::string::operator+=((string *)local_d8,".py");
      this->pure_python_workable_ =
           (bool)(~options.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
      psVar6 = FileDescriptor::name_abi_cxx11_(file);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_e8,psVar6);
      stringpiece_internal::StringPiece::StringPiece
                ((StringPiece *)&fdp.source_code_info_,"google/protobuf/");
      bVar1 = HasPrefixString(local_e8,stack0xffffffffffffff08);
      if (bVar1) {
        this->pure_python_workable_ = true;
      }
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&output);
      FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)&output);
      MessageLite::SerializeToString((MessageLite *)&output,&this->file_descriptor_serialized_);
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_d8);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_1d8,(pointer)CONCAT44(extraout_var,iVar2));
      pZVar7 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_1d8);
      printer.annotation_collector_._7_1_ = 0;
      if (pZVar7 == (pointer)0x0) {
        internal::LogMessage::LogMessage
                  (&local_210,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
                   ,0x157);
        printer.annotation_collector_._7_1_ = 1;
        other = internal::LogMessage::operator<<(&local_210,"CHECK failed: output.get(): ");
        internal::LogFinisher::operator=
                  ((LogFinisher *)((long)&printer.annotation_collector_ + 6),other);
      }
      if ((printer.annotation_collector_._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_210);
      }
      pZVar7 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_1d8);
      io::Printer::Printer((Printer *)local_2b8,pZVar7,'$');
      this->printer_ = (Printer *)local_2b8;
      file_00 = this->file_;
      printer_00 = this->printer_;
      bVar1 = GeneratingDescriptorProto(this);
      anon_unknown_0::PrintTopBoilerplate(printer_00,file_00,bVar1);
      if ((this->pure_python_workable_ & 1U) != 0) {
        PrintImports(this);
      }
      PrintFileDescriptor(this);
      PrintTopLevelEnums(this);
      PrintTopLevelExtensions(this);
      if ((this->pure_python_workable_ & 1U) != 0) {
        bVar1 = GeneratingDescriptorProto(this);
        if (bVar1) {
          io::Printer::Print<>(this->printer_,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
          io::Printer::Indent(this->printer_);
          PrintAllNestedEnumsInFile(this,kCreate);
          PrintMessageDescriptors(this,kCreate);
          FixForeignFieldsInDescriptors(this);
          io::Printer::Outdent(this->printer_);
          io::Printer::Print<>(this->printer_,"else:\n");
          io::Printer::Indent(this->printer_);
        }
        PrintMessageDescriptors(this,kFind);
        PrintAllNestedEnumsInFile(this,kFind);
        bVar1 = GeneratingDescriptorProto(this);
        if (bVar1) {
          io::Printer::Outdent(this->printer_);
        }
      }
      PrintMessages(this);
      if ((this->pure_python_workable_ & 1U) != 0) {
        PrintServiceDescriptors(this);
        io::Printer::Print<>((Printer *)local_2b8,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
        io::Printer::Indent(this->printer_);
        FixForeignFieldsInExtensions(this);
        FixAllDescriptorOptions(this);
        SetSerializedPbInterval(this);
        io::Printer::Outdent(this->printer_);
      }
      bVar1 = anon_unknown_0::HasGenericServices(file);
      if (bVar1) {
        PrintServices(this);
      }
      io::Printer::Print<>((Printer *)local_2b8,"# @@protoc_insertion_point(module_scope)\n");
      bVar1 = io::Printer::failed((Printer *)local_2b8);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      io::Printer::~Printer((Printer *)local_2b8);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_1d8);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&output);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      internal::MutexLock::~MutexLock((MutexLock *)((long)&module_name.field_2 + 8));
LAB_004dfe12:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_58);
      return this_local._7_1_;
    }
    pvVar5 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,(long)local_68);
    bVar1 = std::operator==(&pvVar5->first,"cpp_generated_lib_linked");
    if (!bVar1) {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_58,(long)local_68);
      std::operator+(&local_88,"Unknown generator option: ",&pvVar5->first);
      std::__cxx11::string::operator=((string *)error,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      this_local._7_1_ = false;
      goto LAB_004dfe12;
    }
    options.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const std::string& parameter,
                         GeneratorContext* context, std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options
  bool cpp_generated_lib_linked = false;

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "cpp_generated_lib_linked") {
      cpp_generated_lib_linked = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  std::string module_name = ModuleName(file->name());
  std::string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  pure_python_workable_ = !cpp_generated_lib_linked;
  if (HasPrefixString(file->name(), "google/protobuf/")) {
    pure_python_workable_ = true;
  }

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  if (pure_python_workable_) {
    PrintImports();
  }
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  if (pure_python_workable_) {
    if (GeneratingDescriptorProto()) {
      printer_->Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
      printer_->Indent();
      // Create enums before message descriptors
      PrintAllNestedEnumsInFile(StripPrintDescriptor::kCreate);
      PrintMessageDescriptors(StripPrintDescriptor::kCreate);
      FixForeignFieldsInDescriptors();
      printer_->Outdent();
      printer_->Print("else:\n");
      printer_->Indent();
    }
    // Find the message descriptors first and then use the message
    // descriptor to find enums.
    PrintMessageDescriptors(StripPrintDescriptor::kFind);
    PrintAllNestedEnumsInFile(StripPrintDescriptor::kFind);
    if (GeneratingDescriptorProto()) {
      printer_->Outdent();
    }
  }
  PrintMessages();
  if (pure_python_workable_) {
    PrintServiceDescriptors();

    printer.Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
    printer_->Indent();

    // We have to fix up the extensions after the message classes themselves,
    // since they need to call static RegisterExtension() methods on these
    // classes.
    FixForeignFieldsInExtensions();
    // Descriptor options may have custom extensions. These custom options
    // can only be successfully parsed after we register corresponding
    // extensions. Therefore we parse all options again here to recognize
    // custom options that may be unknown when we define the descriptors.
    // This does not apply to services because they are not used by extensions.
    FixAllDescriptorOptions();

    // Set serialized_start and serialized_end.
    SetSerializedPbInterval();

    printer_->Outdent();
  }
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print("# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}